

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseBandwidth.cpp
# Opt level: O0

void __thiscall tonk::BandwidthShape::Compress(BandwidthShape *this,uint8_t *buffer)

{
  uint uVar1;
  uint8_t uVar2;
  int iVar3;
  ushort *in_RSI;
  uint *in_RDI;
  uint16_t wordAppBPS;
  uint32_t dwordAppBPS;
  uint8_t fecRateByte;
  uint shift;
  uint nonzeroBits;
  ushort local_14;
  
  uVar2 = FECRateToByte((float)in_RDI[1]);
  uVar1 = *in_RDI;
  if (uVar1 == 0) {
    local_14 = 0;
  }
  else if (-LZCOUNT(uVar1) + 0x20U < 0xc) {
    local_14 = (ushort)uVar1;
  }
  else {
    iVar3 = -LZCOUNT(uVar1) + 0x15;
    local_14 = (ushort)(uVar1 >> ((byte)iVar3 & 0x1f)) | (short)iVar3 * 0x800;
  }
  *in_RSI = local_14;
  *(uint8_t *)(in_RSI + 1) = uVar2;
  return;
}

Assistant:

void BandwidthShape::Compress(uint8_t* buffer) const
{
    uint8_t fecRateByte = FECRateToByte(FECRate);

    const uint32_t dwordAppBPS = (uint32_t)AppBPS;
    TONK_DEBUG_ASSERT(dwordAppBPS >= protocol::kMinimumBytesPerSecond);

    const uint16_t wordAppBPS = FixedPointCompress32to16(dwordAppBPS);

    siamese::WriteU16_LE(buffer, wordAppBPS);
    buffer[2] = fecRateByte;
}